

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

int32 fe_build_melfilters(melfb_t *mel_fb)

{
  int16 *piVar1;
  mfcc_t *pmVar2;
  float32 fVar3;
  float fVar4;
  float32 fVar5;
  float fVar6;
  float fVar7;
  float local_5c;
  float local_58;
  float32 hislope;
  float32 loslope;
  float32 hz_1;
  float32 freqs_1 [3];
  float32 hz;
  float32 freqs [3];
  int j;
  int i;
  int n_coeffs;
  float32 fftfreq;
  float32 melbw;
  float32 melmax;
  float32 melmin;
  melfb_t *mel_fb_local;
  
  piVar1 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x231);
  mel_fb->spec_start = piVar1;
  piVar1 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x233);
  mel_fb->filt_start = piVar1;
  piVar1 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x235);
  mel_fb->filt_width = piVar1;
  melbw = fe_mel(mel_fb,mel_fb->lower_filt_freq);
  fVar3 = fe_mel(mel_fb,mel_fb->upper_filt_freq);
  fVar4 = ((float)fVar3 - (float)melbw) / (float)(mel_fb->num_filters + 1);
  if (mel_fb->doublewide != 0) {
    melbw = (float32)((float)melbw - fVar4);
    fVar5 = fe_melinv(mel_fb,melbw);
    if (((float)fVar5 < 0.0) ||
       (fVar5 = fe_melinv(mel_fb,(float32)(fVar4 + (float)fVar3)),
       (float)mel_fb->sampling_rate / 2.0 < (float)fVar5)) {
      fVar5 = fe_melinv(mel_fb,melbw);
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
              ,0x245,"Out of Range: low  filter edge = %f (%f)\n",(double)(float)fVar5,0);
      fVar3 = fe_melinv(mel_fb,(float32)(fVar4 + (float)fVar3));
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
              ,0x248,"              high filter edge = %f (%f)\n",(double)(float)fVar3,
              (double)((float)mel_fb->sampling_rate / 2.0));
      return -10;
    }
  }
  fVar6 = (float)mel_fb->sampling_rate / (float)mel_fb->fft_size;
  j = 0;
  freqs[2] = 0.0;
  do {
    if (mel_fb->num_filters <= (int)freqs[2]) {
      pmVar2 = (mfcc_t *)
               __ckd_malloc__((long)j << 2,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                              ,0x276);
      mel_fb->filt_coeffs = pmVar2;
      j = 0;
      freqs[2] = 0.0;
      do {
        if (mel_fb->num_filters <= (int)freqs[2]) {
          return 0;
        }
        for (freqs[1] = 0.0; (int)freqs[1] < 3; freqs[1] = (float32)((int)freqs[1] + 1)) {
          if (mel_fb->doublewide == 0) {
            fVar3 = fe_melinv(mel_fb,(float32)((float)((int)freqs[2] + (int)freqs[1]) * fVar4 +
                                              (float)melbw));
            (&loslope)[(int)freqs[1]] = fVar3;
          }
          else {
            fVar3 = fe_melinv(mel_fb,(float32)((float)((int)freqs[2] + (int)freqs[1] * 2) * fVar4 +
                                              (float)melbw));
            (&loslope)[(int)freqs[1]] = fVar3;
          }
          if (mel_fb->round_filters != 0) {
            (&loslope)[(int)freqs[1]] =
                 (float32)((float)(int)((float)(&loslope)[(int)freqs[1]] / fVar6 + 0.5) * fVar6);
          }
        }
        for (freqs[1] = 0.0; (int)freqs[1] < (int)mel_fb->filt_width[(int)freqs[2]];
            freqs[1] = (float32)((int)freqs[1] + 1)) {
          fVar7 = (float)((int)mel_fb->spec_start[(int)freqs[2]] + (int)freqs[1]) * fVar6;
          if ((fVar7 < (float)loslope) || ((float)freqs_1[0] < fVar7)) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                    ,0x291,
                    "Failed to create filterbank, frequency range does not match. Sample rate %f, FFT size %d, lowerf %f < freq %f > upperf %f.\n"
                    ,(double)(float)mel_fb->sampling_rate,(double)(float)loslope,(double)fVar7,
                    (double)(float)freqs_1[0],(ulong)(uint)mel_fb->fft_size);
            exit(1);
          }
          local_58 = (fVar7 - (float)loslope) / ((float)hz_1 - (float)loslope);
          local_5c = ((float)freqs_1[0] - fVar7) / ((float)freqs_1[0] - (float)hz_1);
          if (mel_fb->unit_area != 0) {
            local_58 = (2.0 / ((float)freqs_1[0] - (float)loslope)) * local_58;
            local_5c = (2.0 / ((float)freqs_1[0] - (float)loslope)) * local_5c;
          }
          if (local_5c <= local_58) {
            mel_fb->filt_coeffs[j] = (mfcc_t)local_5c;
          }
          else {
            mel_fb->filt_coeffs[j] = (mfcc_t)local_58;
          }
          j = j + 1;
        }
        freqs[2] = (float32)((int)freqs[2] + 1);
      } while( true );
    }
    for (freqs[1] = 0.0; (int)freqs[1] < 3; freqs[1] = (float32)((int)freqs[1] + 1)) {
      if (mel_fb->doublewide == 0) {
        fVar3 = fe_melinv(mel_fb,(float32)((float)((int)freqs[2] + (int)freqs[1]) * fVar4 +
                                          (float)melbw));
        freqs_1[(long)(int)freqs[1] + 2] = fVar3;
      }
      else {
        fVar3 = fe_melinv(mel_fb,(float32)((float)((int)freqs[2] + (int)freqs[1] * 2) * fVar4 +
                                          (float)melbw));
        freqs_1[(long)(int)freqs[1] + 2] = fVar3;
      }
      if (mel_fb->round_filters != 0) {
        freqs_1[(long)(int)freqs[1] + 2] =
             (float32)((float)(int)((float)freqs_1[(long)(int)freqs[1] + 2] / fVar6 + 0.5) * fVar6);
      }
    }
    mel_fb->spec_start[(int)freqs[2]] = -1;
    for (freqs[1] = 0.0; (int)freqs[1] < mel_fb->fft_size / 2 + 1;
        freqs[1] = (float32)((int)freqs[1] + 1)) {
      freqs_1[1] = (float32)((float)(int)freqs[1] * fVar6);
      if ((float)freqs_1[2] <= (float)freqs_1[1]) {
        if (((float)freqs[0] < (float)freqs_1[1]) || (freqs[1] == (float32)(mel_fb->fft_size / 2)))
        {
          mel_fb->filt_width[(int)freqs[2]] = SUB42(freqs[1],0) - mel_fb->spec_start[(int)freqs[2]];
          mel_fb->filt_start[(int)freqs[2]] = (int16)j;
          j = mel_fb->filt_width[(int)freqs[2]] + j;
          break;
        }
        if (mel_fb->spec_start[(int)freqs[2]] == -1) {
          mel_fb->spec_start[(int)freqs[2]] = SUB42(freqs[1],0);
        }
      }
    }
    freqs[2] = (float32)((int)freqs[2] + 1);
  } while( true );
}

Assistant:

int32
fe_build_melfilters(melfb_t * mel_fb)
{
    float32 melmin, melmax, melbw, fftfreq;
    int n_coeffs, i, j;


    /* Filter coefficient matrix, in flattened form. */
    mel_fb->spec_start =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->spec_start));
    mel_fb->filt_start =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->filt_start));
    mel_fb->filt_width =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->filt_width));

    /* First calculate the widths of each filter. */
    /* Minimum and maximum frequencies in mel scale. */
    melmin = fe_mel(mel_fb, mel_fb->lower_filt_freq);
    melmax = fe_mel(mel_fb, mel_fb->upper_filt_freq);

    /* Width of filters in mel scale */
    melbw = (melmax - melmin) / (mel_fb->num_filters + 1);
    if (mel_fb->doublewide) {
        melmin -= melbw;
        melmax += melbw;
        if ((fe_melinv(mel_fb, melmin) < 0) ||
            (fe_melinv(mel_fb, melmax) > mel_fb->sampling_rate / 2)) {
            E_WARN
                ("Out of Range: low  filter edge = %f (%f)\n",
                 fe_melinv(mel_fb, melmin), 0.0);
            E_WARN
                ("              high filter edge = %f (%f)\n",
                 fe_melinv(mel_fb, melmax), mel_fb->sampling_rate / 2);
            return FE_INVALID_PARAM_ERROR;
        }
    }

    /* DFT point spacing */
    fftfreq = mel_fb->sampling_rate / (float32) mel_fb->fft_size;

    /* Count and place filter coefficients. */
    n_coeffs = 0;
    for (i = 0; i < mel_fb->num_filters; ++i) {
        float32 freqs[3];

        /* Left, center, right frequencies in Hertz */
        for (j = 0; j < 3; ++j) {
            if (mel_fb->doublewide)
                freqs[j] = fe_melinv(mel_fb, (i + j * 2) * melbw + melmin);
            else
                freqs[j] = fe_melinv(mel_fb, (i + j) * melbw + melmin);
            /* Round them to DFT points if requested */
            if (mel_fb->round_filters)
                freqs[j] = ((int) (freqs[j] / fftfreq + 0.5)) * fftfreq;
        }

        /* spec_start is the start of this filter in the power spectrum. */
        mel_fb->spec_start[i] = -1;
        /* There must be a better way... */
        for (j = 0; j < mel_fb->fft_size / 2 + 1; ++j) {
            float32 hz = j * fftfreq;
            if (hz < freqs[0])
                continue;
            else if (hz > freqs[2] || j == mel_fb->fft_size / 2) {
                /* filt_width is the width in DFT points of this filter. */
                mel_fb->filt_width[i] = j - mel_fb->spec_start[i];
                /* filt_start is the start of this filter in the filt_coeffs array. */
                mel_fb->filt_start[i] = n_coeffs;
                n_coeffs += mel_fb->filt_width[i];
                break;
            }
            if (mel_fb->spec_start[i] == -1)
                mel_fb->spec_start[i] = j;
        }
    }

    /* Now go back and allocate the coefficient array. */
    mel_fb->filt_coeffs =
        ckd_malloc(n_coeffs * sizeof(*mel_fb->filt_coeffs));

    /* And now generate the coefficients. */
    n_coeffs = 0;
    for (i = 0; i < mel_fb->num_filters; ++i) {
        float32 freqs[3];

        /* Left, center, right frequencies in Hertz */
        for (j = 0; j < 3; ++j) {
            if (mel_fb->doublewide)
                freqs[j] = fe_melinv(mel_fb, (i + j * 2) * melbw + melmin);
            else
                freqs[j] = fe_melinv(mel_fb, (i + j) * melbw + melmin);
            /* Round them to DFT points if requested */
            if (mel_fb->round_filters)
                freqs[j] = ((int) (freqs[j] / fftfreq + 0.5)) * fftfreq;
        }

        for (j = 0; j < mel_fb->filt_width[i]; ++j) {
            float32 hz, loslope, hislope;

            hz = (mel_fb->spec_start[i] + j) * fftfreq;
            if (hz < freqs[0] || hz > freqs[2]) {
                E_FATAL
                    ("Failed to create filterbank, frequency range does not match. "
                     "Sample rate %f, FFT size %d, lowerf %f < freq %f > upperf %f.\n",
                     mel_fb->sampling_rate, mel_fb->fft_size, freqs[0], hz,
                     freqs[2]);
            }
            loslope = (hz - freqs[0]) / (freqs[1] - freqs[0]);
            hislope = (freqs[2] - hz) / (freqs[2] - freqs[1]);
            if (mel_fb->unit_area) {
                loslope *= 2 / (freqs[2] - freqs[0]);
                hislope *= 2 / (freqs[2] - freqs[0]);
            }
            if (loslope < hislope) {
#ifdef FIXED_POINT
                mel_fb->filt_coeffs[n_coeffs] = fe_log(loslope);
#else
                mel_fb->filt_coeffs[n_coeffs] = loslope;
#endif
            }
            else {
#ifdef FIXED_POINT
                mel_fb->filt_coeffs[n_coeffs] = fe_log(hislope);
#else
                mel_fb->filt_coeffs[n_coeffs] = hislope;
#endif
            }
            ++n_coeffs;
        }
    }

    return FE_SUCCESS;
}